

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_sockaddr_is_loopback_(sockaddr *addr)

{
  bool bVar1;
  undefined1 auVar2 [16];
  
  if (addr->sa_family == 10) {
    auVar2[0] = -(addr->sa_data[6] == '\0');
    auVar2[1] = -(addr->sa_data[7] == '\0');
    auVar2[2] = -(addr->sa_data[8] == '\0');
    auVar2[3] = -(addr->sa_data[9] == '\0');
    auVar2[4] = -(addr->sa_data[10] == '\0');
    auVar2[5] = -(addr->sa_data[0xb] == '\0');
    auVar2[6] = -(addr->sa_data[0xc] == '\0');
    auVar2[7] = -(addr->sa_data[0xd] == '\0');
    auVar2[8] = -((char)addr[1].sa_family == '\0');
    auVar2[9] = -(*(char *)((long)&addr[1].sa_family + 1) == '\0');
    auVar2[10] = -(addr[1].sa_data[0] == '\0');
    auVar2[0xb] = -(addr[1].sa_data[1] == '\0');
    auVar2[0xc] = -(addr[1].sa_data[2] == '\0');
    auVar2[0xd] = -(addr[1].sa_data[3] == '\0');
    auVar2[0xe] = -(addr[1].sa_data[4] == '\0');
    auVar2[0xf] = -(addr[1].sa_data[5] == '\x01');
    bVar1 = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
  }
  else if (addr->sa_family == 2) {
    bVar1 = addr->sa_data[2] == '\x7f';
  }
  else {
    bVar1 = false;
  }
  return (int)bVar1;
}

Assistant:

int
evutil_sockaddr_is_loopback_(const struct sockaddr *addr)
{
	static const char LOOPBACK_S6[16] =
	    "\0\0\0\0\0\0\0\0\0\0\0\0\0\0\0\1";
	if (addr->sa_family == AF_INET) {
		struct sockaddr_in *sin = (struct sockaddr_in *)addr;
		return (ntohl(sin->sin_addr.s_addr) & 0xff000000) == 0x7f000000;
	} else if (addr->sa_family == AF_INET6) {
		struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)addr;
		return !memcmp(sin6->sin6_addr.s6_addr, LOOPBACK_S6, 16);
	}
	return 0;
}